

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailure.cpp
# Opt level: O3

void __thiscall
MockUnexpectedCallHappenedFailure::MockUnexpectedCallHappenedFailure
          (MockUnexpectedCallHappenedFailure *this,UtestShell *test,SimpleString *name,
          MockExpectedCallsList *expectations)

{
  SimpleString *this_00;
  int iVar1;
  char *pcVar2;
  SimpleString ordinalNumber;
  SimpleString local_40;
  SimpleString local_30;
  
  MockFailure::MockFailure(&this->super_MockFailure,test);
  (this->super_MockFailure).super_TestFailure._vptr_TestFailure =
       (_func_int **)&PTR__TestFailure_002e65b8;
  iVar1 = (*expectations->_vptr_MockExpectedCallsList[4])(expectations,name);
  if (iVar1 == 0) {
    SimpleString::SimpleString(&local_40,"Mock Failure: Unexpected call to function: ");
    SimpleString::operator=(&(this->super_MockFailure).super_TestFailure.message_,&local_40);
  }
  else {
    StringFromOrdinalNumber((uint)&local_40);
    pcVar2 = SimpleString::asCharString(&local_40);
    StringFromFormat((char *)&local_30,"Mock Failure: Unexpected additional (%s) call to function: "
                     ,pcVar2);
    SimpleString::operator=(&(this->super_MockFailure).super_TestFailure.message_,&local_30);
    SimpleString::~SimpleString(&local_30);
  }
  SimpleString::~SimpleString(&local_40);
  this_00 = &(this->super_MockFailure).super_TestFailure.message_;
  SimpleString::operator+=(this_00,name);
  SimpleString::operator+=(this_00,"\n");
  MockFailure::addExpectationsAndCallHistory(&this->super_MockFailure,expectations);
  return;
}

Assistant:

MockUnexpectedCallHappenedFailure::MockUnexpectedCallHappenedFailure(UtestShell* test, const SimpleString& name, const MockExpectedCallsList& expectations) : MockFailure(test)
{
    unsigned int amountOfActualCalls = expectations.amountOfActualCallsFulfilledFor(name);
    if (amountOfActualCalls > 0) {
        SimpleString ordinalNumber = StringFromOrdinalNumber(amountOfActualCalls + 1);
        message_ = StringFromFormat("Mock Failure: Unexpected additional (%s) call to function: ", ordinalNumber.asCharString());
    } else {
        message_ = "Mock Failure: Unexpected call to function: ";
    }
    message_ += name;
    message_ += "\n";
    addExpectationsAndCallHistory(expectations);
}